

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::RandSequenceStatementSyntax::setChild
          (RandSequenceStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00537708 + *(int *)(&DAT_00537708 + index * 4)))();
  return;
}

Assistant:

void RandSequenceStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: randsequence = child.token(); return;
        case 3: openParen = child.token(); return;
        case 4: firstProduction = child.token(); return;
        case 5: closeParen = child.token(); return;
        case 6: productions = child.node()->as<SyntaxList<ProductionSyntax>>(); return;
        case 7: endsequence = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}